

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

TValueCC calcCC(TKeyWaveformF *waveform0,TKeyWaveformF *waveform1,double sum0,double sum02,int is00,
               int is0,int is1)

{
  float fVar1;
  ulong uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  uVar3 = is1 - is0;
  if (uVar3 == 0 || is1 < is0) {
    dVar4 = 0.0;
    dVar5 = 0.0;
    dVar7 = 0.0;
  }
  else {
    dVar4 = 0.0;
    dVar5 = 0.0;
    dVar7 = 0.0;
    uVar2 = 0;
    do {
      fVar1 = (waveform1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[(long)is0 + uVar2];
      dVar4 = dVar4 + (double)(fVar1 * fVar1);
      dVar5 = dVar5 + (double)fVar1;
      dVar7 = dVar7 + (double)(fVar1 * (waveform0->super__Vector_base<float,_std::allocator<float>_>
                                       )._M_impl.super__Vector_impl_data._M_start
                                       [(long)is00 + uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  dVar6 = (double)(int)uVar3;
  dVar4 = (dVar6 * dVar4 - dVar5 * dVar5) * (dVar6 * sum02 - sum0 * sum0);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  return (dVar7 * dVar6 + -dVar5 * sum0) / dVar4;
}

Assistant:

TValueCC calcCC(
    const TKeyWaveformF & waveform0,
    const TKeyWaveformF & waveform1,
    double sum0, double sum02,
    int is00, int is0, int is1) {
    TValueCC cc = -1.0f;

    double sum1 = 0.0f;
    double sum12 = 0.0f;
    double sum01 = 0.0f;
    for (int is = 0; is < is1 - is0; ++is) {
        auto a0 = waveform0[is00 + is];
        auto a1 = waveform1[is0 + is];

#ifdef MY_DEBUG
        if (is00 + is < 0 || is00 + is >= waveform0.size()) printf("BUG 0\n");
        if (is0 + is < 0 || is0 + is >= waveform1.size()) {
            printf("BUG 1\n");
            printf("%d %d %d\n", is0, is, (int) waveform1.size());
        }
#endif

        sum1 += a1;
        sum12 += a1*a1;
        sum01 += a0*a1;
    }

    int ncc = (is1 - is0);
    {
        double nom = sum01*ncc - sum0*sum1;
        double den2a = sum02*ncc - sum0*sum0;
        double den2b = sum12*ncc - sum1*sum1;
        cc = (nom)/(sqrt(den2a*den2b));
    }

    return cc;
}